

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::ValidatePrimElementName(string *name)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_20;
  size_t i;
  string *name_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name);
    iVar1 = isdigit((int)*pcVar3);
    if (iVar1 == 0) {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name);
      iVar1 = isalpha((int)*pcVar3);
      if ((iVar1 == 0) &&
         (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name), *pcVar3 != '_')) {
        name_local._7_1_ = false;
      }
      else {
        for (local_20 = 1; uVar2 = ::std::__cxx11::string::size(), local_20 < uVar2;
            local_20 = local_20 + 1) {
          pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name);
          iVar1 = isalnum((int)*pcVar3);
          if ((iVar1 == 0) &&
             (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name), *pcVar3 != '_')) {
            return false;
          }
        }
        name_local._7_1_ = true;
      }
    }
    else {
      name_local._7_1_ = false;
    }
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool ValidatePrimElementName(const std::string &name) {
  if (name.empty()) {
    return false;
  }

  // alphanum + '_'
  // first char must not be number.

  if (std::isdigit(int(name[0]))) {
    return false;
  } else if (std::isalpha(int(name[0]))) {
    // ok
  } else if (name[0] == '_') {
    // ok
  } else {
    return false;
  }

  for (size_t i = 1; i < name.size(); i++) {
    if (std::isalnum(int(name[i])) || (name[i] == '_')) {
      // ok
    } else {
      return false;
    }
  }

  return true;
}